

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void anon_unknown.dwarf_104f1::usageMessage(ostream *stream,char *program_name,bool verbose)

{
  char *pcVar1;
  size_t sVar2;
  string compressionNames;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar2 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," [options] infile outfile",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  std::ostream::flush();
  if (verbose) {
    local_38 = 0;
    local_30 = '\0';
    local_60[0] = local_50;
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/","");
    Imf_3_4::getCompressionNamesString((string *)local_60,(string *)&local_40);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\nRead an OpenEXR image from infile, produce a tiled\nversion of the image, and save the result in outfile.\n\nOptions:\n\n  -o            produces a ONE_LEVEL image (default)\n\n  -m            produces a MIPMAP_LEVELS multiresolution image\n\n  -r            produces a RIPMAP_LEVELS multiresolution image\n\n  -f c          when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n                is produced, image channel c will be resampled\n                without low-pass filtering.  This option can\n                be specified multiple times to disable low-pass\n                filtering for multiple channels.\n\n  -e x y        when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n                is produced, low-pass filtering takes samples\n                outside the image\'s data window.  This requires\n                extrapolating the image.  Option -e specifies\n                how the image is extrapolated horizontally and\n                vertically (black/clamp/periodic/mirror, default\n                is clamp).\n\n  -t x y        sets the tile size in the output image to\n                x by y pixels (default is 64 by 64)\n\n  -d            sets level size rounding to ROUND_DOWN (default)\n\n  -u            sets level size rounding to ROUND_UP\n\n  -z x          sets the data compression method to x\n                ("
               ,0x517);
    pcVar1 = local_40;
    if (local_40 == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar2 = strlen(local_40);
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               ",\n                default is zip)\n\n  -v            verbose mode\n\n  -h, --help    print this message\n\n      --version print version information\n\nMultipart Options:\n\n  -p i          part number, default is 0\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x139);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
    {
        std::string compressionNames;
        getCompressionNamesString ("/", compressionNames);

        stream
            << "\n"
               "Read an OpenEXR image from infile, produce a tiled\n"
               "version of the image, and save the result in outfile.\n"
               "\n"
               "Options:\n"
               "\n"
               "  -o            produces a ONE_LEVEL image (default)\n"
               "\n"
               "  -m            produces a MIPMAP_LEVELS multiresolution image\n"
               "\n"
               "  -r            produces a RIPMAP_LEVELS multiresolution image\n"
               "\n"
               "  -f c          when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n"
               "                is produced, image channel c will be resampled\n"
               "                without low-pass filtering.  This option can\n"
               "                be specified multiple times to disable low-pass\n"
               "                filtering for multiple channels.\n"
               "\n"
               "  -e x y        when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n"
               "                is produced, low-pass filtering takes samples\n"
               "                outside the image's data window.  This requires\n"
               "                extrapolating the image.  Option -e specifies\n"
               "                how the image is extrapolated horizontally and\n"
               "                vertically (black/clamp/periodic/mirror, default\n"
               "                is clamp).\n"
               "\n"
               "  -t x y        sets the tile size in the output image to\n"
               "                x by y pixels (default is 64 by 64)\n"
               "\n"
               "  -d            sets level size rounding to ROUND_DOWN (default)\n"
               "\n"
               "  -u            sets level size rounding to ROUND_UP\n"
               "\n"
               "  -z x          sets the data compression method to x\n"
               "                ("
            << compressionNames.c_str ()
            << ",\n"
               "                default is zip)\n"
               "\n"
               "  -v            verbose mode\n"
               "\n"
               "  -h, --help    print this message\n"
               "\n"
               "      --version print version information\n"
               "\n"
               "Multipart Options:\n"
               "\n"
               "  -p i          part number, default is 0\n"
               "\n"
               "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               "";
    }
}